

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O1

void Bbl_ManStop(Bbl_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Str_t *pVVar2;
  
  pVVar1 = p->vId2Obj;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vObj2Id;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vFaninNums;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (int *)0x0;
    }
    free(pVVar1);
  }
  if (p->pFileData != (char *)0x0) {
    free(p->pFileData);
    p->pFileData = (char *)0x0;
    p->pName->pArray = (char *)0x0;
    p->pObjs->pArray = (char *)0x0;
    p->pFncs->pArray = (char *)0x0;
  }
  pVVar2 = p->pEnts;
  if (pVVar2 != (Vec_Str_t *)0x0) {
    if (pVVar2->pArray != (char *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (char *)0x0;
    }
    free(pVVar2);
  }
  pVVar2 = p->pName;
  if (pVVar2->pArray != (char *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (char *)0x0;
  }
  if (pVVar2 != (Vec_Str_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->pObjs;
  if (pVVar2->pArray != (char *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (char *)0x0;
  }
  if (pVVar2 != (Vec_Str_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->pFncs;
  if (pVVar2->pArray != (char *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (char *)0x0;
  }
  if (pVVar2 != (Vec_Str_t *)0x0) {
    free(pVVar2);
  }
  free(p);
  return;
}

Assistant:

void Bbl_ManStop( Bbl_Man_t * p )
{
    if ( p->vId2Obj )    Vec_IntFree( p->vId2Obj );
    if ( p->vObj2Id )    Vec_IntFree( p->vObj2Id );
    if ( p->vFaninNums ) Vec_IntFree( p->vFaninNums );
    if ( p->pFileData )
    {
        BBLIF_FREE( p->pFileData );
        p->pName->pArray = NULL;
        p->pObjs->pArray = NULL;
        p->pFncs->pArray = NULL;
    }
    if ( p->pEnts )
    Vec_StrFree( p->pEnts );
    Vec_StrFree( p->pName );
    Vec_StrFree( p->pObjs );
    Vec_StrFree( p->pFncs );
    BBLIF_FREE( p );
}